

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.hpp
# Opt level: O0

void __thiscall
MutableArray::MutableArray(MutableArray *this,vector<Item,_std::allocator<Item>_> *init)

{
  size_type sVar1;
  vector<Item,_std::allocator<Item>_> *init_local;
  MutableArray *this_local;
  
  Array::Array(&this->super_Array);
  (this->super_Array).super_Container.super_Object._vptr_Object =
       (_func_int **)&PTR_serialize_0017c978;
  std::vector<Item,_std::allocator<Item>_>::operator=(&(this->super_Array).content,init);
  sVar1 = std::vector<Item,_std::allocator<Item>_>::size(init);
  this->length = (int)sVar1;
  return;
}

Assistant:

MutableArray(vector<Item> init) {
	  this->content = init;
	  this->length = init.size();
  }